

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btBoxBoxCollisionAlgorithm::processCollision
          (btBoxBoxCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btCollisionShape *box1;
  btCollisionShape *box2;
  btTransform *pbVar1;
  btPersistentManifold *this_00;
  btCollisionObject *pbVar2;
  btCollisionObject *pbVar3;
  btBoxBoxDetector detector;
  btBoxBoxDetector local_d0;
  ClosestPointInput local_b8;
  
  if (this->m_manifoldPtr != (btPersistentManifold *)0x0) {
    box1 = body0Wrap->m_shape;
    box2 = body1Wrap->m_shape;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    local_b8.m_maximumDistanceSquared = 1e+18;
    pbVar1 = body0Wrap->m_worldTransform;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
    local_b8.m_transformA.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
    local_b8.m_transformA.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformA.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar1->m_origin).m_floats;
    local_b8.m_transformA.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar1->m_origin).m_floats + 2)
    ;
    pbVar1 = body1Wrap->m_worldTransform;
    local_b8.m_transformB.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
    local_b8.m_transformB.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
    local_b8.m_transformB.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
    local_b8.m_transformB.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformB.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
    local_b8.m_transformB.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformB.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar1->m_origin).m_floats;
    local_b8.m_transformB.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar1->m_origin).m_floats + 2)
    ;
    btBoxBoxDetector::btBoxBoxDetector(&local_d0,(btBoxShape *)box1,(btBoxShape *)box2);
    btBoxBoxDetector::getClosestPoints
              (&local_d0,&local_b8,&resultOut->super_Result,dispatchInfo->m_debugDraw,false);
    if ((this->m_ownManifold == true) &&
       (this_00 = resultOut->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pbVar3 = resultOut->m_body0Wrap->m_collisionObject;
      if (this_00->m_body0 == pbVar3) {
        pbVar2 = resultOut->m_body1Wrap->m_collisionObject;
      }
      else {
        pbVar2 = pbVar3;
        pbVar3 = resultOut->m_body1Wrap->m_collisionObject;
      }
      btPersistentManifold::refreshContactPoints
                (this_00,&pbVar3->m_worldTransform,&pbVar2->m_worldTransform);
    }
  }
  return;
}

Assistant:

void btBoxBoxCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	if (!m_manifoldPtr)
		return;

	
	const btBoxShape* box0 = (btBoxShape*)body0Wrap->getCollisionShape();
	const btBoxShape* box1 = (btBoxShape*)body1Wrap->getCollisionShape();



	/// report a contact. internally this will be kept persistent, and contact reduction is done
	resultOut->setPersistentManifold(m_manifoldPtr);
#ifndef USE_PERSISTENT_CONTACTS	
	m_manifoldPtr->clearManifold();
#endif //USE_PERSISTENT_CONTACTS

	btDiscreteCollisionDetectorInterface::ClosestPointInput input;
	input.m_maximumDistanceSquared = BT_LARGE_FLOAT;
	input.m_transformA = body0Wrap->getWorldTransform();
	input.m_transformB = body1Wrap->getWorldTransform();

	btBoxBoxDetector detector(box0,box1);
	detector.getClosestPoints(input,*resultOut,dispatchInfo.m_debugDraw);

#ifdef USE_PERSISTENT_CONTACTS
	//  refreshContactPoints is only necessary when using persistent contact points. otherwise all points are newly added
	if (m_ownManifold)
	{
		resultOut->refreshContactPoints();
	}
#endif //USE_PERSISTENT_CONTACTS

}